

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O2

void bn_mont_reduction_u32(uint32_t len,uint32_t *n,uint32_t nInv,uint32_t *c,uint32_t *res)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t __n;
  uint uVar6;
  uint32_t i;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  ulong uVar13;
  uint32_t *os;
  ulong uVar14;
  ulong uVar15;
  void *__s;
  undefined8 uStack_70;
  uint auStack_68 [2];
  undefined8 local_60;
  ulong local_58;
  ulong local_50;
  uint32_t *local_48;
  size_t local_40;
  uint local_34;
  
  local_58 = (ulong)(len >> 2);
  uVar14 = (ulong)len;
  local_48 = c + uVar14;
  local_50 = (ulong)(len & 0xfffffffc);
  puVar11 = c + 3;
  local_34 = 0;
  puVar12 = c;
  for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
    uVar13 = (ulong)(c[uVar10] * nInv);
    uVar15 = 0;
    for (lVar7 = 0; uVar8 = local_50, local_58 << 4 != lVar7; lVar7 = lVar7 + 0x10) {
      uVar15 = uVar15 + *(uint *)((long)puVar11 + lVar7 + -0xc) +
               *(uint *)((long)n + lVar7) * uVar13;
      *(int *)((long)puVar11 + lVar7 + -0xc) = (int)uVar15;
      uVar15 = *(uint *)((long)n + lVar7 + 4) * uVar13 +
               (ulong)*(uint *)((long)puVar11 + lVar7 + -8) + (uVar15 >> 0x20);
      *(int *)((long)puVar11 + lVar7 + -8) = (int)uVar15;
      uVar15 = *(uint *)((long)n + lVar7 + 8) * uVar13 +
               (ulong)*(uint *)((long)puVar11 + lVar7 + -4) + (uVar15 >> 0x20);
      *(int *)((long)puVar11 + lVar7 + -4) = (int)uVar15;
      uVar15 = *(uint *)((long)n + lVar7 + 0xc) * uVar13 + (ulong)*(uint *)((long)puVar11 + lVar7) +
               (uVar15 >> 0x20);
      *(int *)((long)puVar11 + lVar7) = (int)uVar15;
      uVar15 = uVar15 >> 0x20;
    }
    for (; uVar8 < uVar14; uVar8 = uVar8 + 1) {
      uVar15 = uVar15 + puVar12[uVar8] + n[uVar8] * uVar13;
      puVar12[uVar8] = (uint32_t)uVar15;
      uVar15 = uVar15 >> 0x20;
    }
    uVar2 = (uint)((char)local_34 != '\0');
    uVar6 = c[(int)uVar10 + len];
    uVar3 = (uint)uVar15 + c[(int)uVar10 + len];
    local_48[uVar10] = uVar3 + uVar2;
    local_34 = (uint)(CARRY4((uint)uVar15,uVar6) || CARRY4(uVar3,uVar2));
    puVar11 = puVar11 + 1;
    puVar12 = puVar12 + 1;
  }
  local_40 = uVar14 * 4;
  uStack_70 = 0x12e5fa;
  local_60 = res;
  memcpy(res,local_48,local_40);
  __n = local_40;
  lVar7 = -(uVar14 * 4 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)auStack_68 + lVar7);
  *(undefined8 *)((long)auStack_68 + lVar7 + -8) = 0x12e61f;
  memset(__s,0,__n);
  uVar6 = 0;
  for (lVar9 = 0; uVar10 = local_50, (local_58 & 0xffffffff) << 4 != lVar9; lVar9 = lVar9 + 0x10) {
    uVar2 = *(uint *)((long)res + lVar9);
    uVar4 = (uint)((char)uVar6 != '\0');
    uVar6 = *(uint *)((long)n + lVar9);
    uVar5 = uVar2 - *(uint *)((long)n + lVar9);
    *(uint *)((long)__s + lVar9) = uVar5 - uVar4;
    uVar3 = *(uint *)((long)res + lVar9 + 4);
    puVar1 = (uint *)((long)n + lVar9 + 4);
    uVar4 = (uint)(uVar2 < uVar6 || uVar5 < uVar4);
    uVar6 = *puVar1;
    uVar5 = uVar3 - *puVar1;
    *(uint *)((long)auStack_68 + lVar9 + lVar7 + 4) = uVar5 - uVar4;
    uVar2 = *(uint *)((long)res + lVar9 + 8);
    puVar1 = (uint *)((long)n + lVar9 + 8);
    uVar4 = (uint)(uVar3 < uVar6 || uVar5 < uVar4);
    uVar6 = *puVar1;
    uVar5 = uVar2 - *puVar1;
    *(uint *)((long)&local_60 + lVar9 + lVar7) = uVar5 - uVar4;
    uVar3 = *(uint *)((long)res + lVar9 + 0xc);
    puVar1 = (uint *)((long)n + lVar9 + 0xc);
    uVar2 = (uint)(uVar2 < uVar6 || uVar5 < uVar4);
    uVar6 = *puVar1;
    uVar4 = uVar3 - *puVar1;
    *(uint *)((long)&local_60 + lVar9 + lVar7 + 4) = uVar4 - uVar2;
    uVar6 = (uint)(uVar3 < uVar6 || uVar4 < uVar2);
  }
  for (; uVar10 < uVar14; uVar10 = uVar10 + 1) {
    uVar2 = res[uVar10];
    uVar3 = (uint)((char)uVar6 != '\0');
    uVar6 = n[uVar10];
    uVar4 = uVar2 - n[uVar10];
    *(uint *)((long)__s + uVar10 * 4) = uVar4 - uVar3;
    uVar6 = (uint)(uVar2 < uVar6 || uVar4 < uVar3);
  }
  for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
    res[uVar10] = *(uint *)((long)__s + uVar10 * 4) & ~(local_34 - uVar6) |
                  res[uVar10] & local_34 - uVar6;
  }
  return;
}

Assistant:

static void
bn_mont_reduction_u32(uint32_t len, uint32_t *n, uint32_t nInv, uint32_t *c, uint32_t *res)
{
  uint32_t c0 = 0U;
  for (uint32_t i0 = 0U; i0 < len; i0++)
  {
    uint32_t qj = nInv * c[i0];
    uint32_t *res_j0 = c + i0;
    uint32_t c1 = 0U;
    for (uint32_t i = 0U; i < len / 4U; i++)
    {
      uint32_t a_i = n[4U * i];
      uint32_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i0);
      uint32_t a_i0 = n[4U * i + 1U];
      uint32_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, qj, c1, res_i1);
      uint32_t a_i1 = n[4U * i + 2U];
      uint32_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, qj, c1, res_i2);
      uint32_t a_i2 = n[4U * i + 3U];
      uint32_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, qj, c1, res_i);
    }
    for (uint32_t i = len / 4U * 4U; i < len; i++)
    {
      uint32_t a_i = n[i];
      uint32_t *res_i = res_j0 + i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i);
    }
    uint32_t r = c1;
    uint32_t c10 = r;
    uint32_t *resb = c + len + i0;
    uint32_t res_j = c[len + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, c10, res_j, resb);
  }
  memcpy(res, c + len, (len + len - len) * sizeof (uint32_t));
  uint32_t c00 = c0;
  KRML_CHECK_SIZE(sizeof (uint32_t), len);
  uint32_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint32_t));
  uint32_t c1 = 0U;
  for (uint32_t i = 0U; i < len / 4U; i++)
  {
    uint32_t t1 = res[4U * i];
    uint32_t t20 = n[4U * i];
    uint32_t *res_i0 = tmp + 4U * i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t1, t20, res_i0);
    uint32_t t10 = res[4U * i + 1U];
    uint32_t t21 = n[4U * i + 1U];
    uint32_t *res_i1 = tmp + 4U * i + 1U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t10, t21, res_i1);
    uint32_t t11 = res[4U * i + 2U];
    uint32_t t22 = n[4U * i + 2U];
    uint32_t *res_i2 = tmp + 4U * i + 2U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t11, t22, res_i2);
    uint32_t t12 = res[4U * i + 3U];
    uint32_t t2 = n[4U * i + 3U];
    uint32_t *res_i = tmp + 4U * i + 3U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t12, t2, res_i);
  }
  for (uint32_t i = len / 4U * 4U; i < len; i++)
  {
    uint32_t t1 = res[i];
    uint32_t t2 = n[i];
    uint32_t *res_i = tmp + i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t1, t2, res_i);
  }
  uint32_t c10 = c1;
  uint32_t c2 = c00 - c10;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint32_t *os = res;
    uint32_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;
  }
}